

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_AllowEnumAlias_Test::
~ValidationErrorTest_AllowEnumAlias_Test(ValidationErrorTest_AllowEnumAlias_Test *this)

{
  ValidationErrorTest_AllowEnumAlias_Test *this_local;
  
  ~ValidationErrorTest_AllowEnumAlias_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, AllowEnumAlias) {
  BuildFile(
      "name: \"foo.proto\" "
      "enum_type {"
      "  name: \"Bar\""
      "  value { name:\"ENUM_A\" number:0 }"
      "  value { name:\"ENUM_B\" number:0 }"
      "  options { allow_alias: true }"
      "}");
}